

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

Hop_Obj_t * Hop_Permute(Hop_Man_t *p,Hop_Obj_t *pRoot,int nRootVars,int *pPermute)

{
  int iVar1;
  undefined8 *puVar2;
  Hop_Obj_t *pHVar3;
  ulong uVar4;
  Hop_Obj_t *pObj;
  
  pObj = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
  iVar1 = Hop_ObjIsConst1(pObj);
  if (iVar1 == 0) {
    for (uVar4 = 0; (long)uVar4 < (long)p->vPis->nSize; uVar4 = uVar4 + 1) {
      puVar2 = (undefined8 *)Vec_PtrEntry(p->vPis,(int)uVar4);
      if ((uint)nRootVars == uVar4) break;
      iVar1 = pPermute[uVar4];
      if ((iVar1 < 0) || (p->nObjs[2] <= iVar1)) {
        __assert_fail("pPermute[i] >= 0 && pPermute[i] < Hop_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                      ,0x23f,"Hop_Obj_t *Hop_Permute(Hop_Man_t *, Hop_Obj_t *, int, int *)");
      }
      pHVar3 = Hop_IthVar(p,iVar1);
      *puVar2 = pHVar3;
    }
    Hop_Remap_rec(p,pObj);
    Hop_ConeUnmark_rec(pObj);
    pRoot = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pObj->field_0).pData);
  }
  return pRoot;
}

Assistant:

Hop_Obj_t * Hop_Permute( Hop_Man_t * p, Hop_Obj_t * pRoot, int nRootVars, int * pPermute )
{
    Hop_Obj_t * pObj;
    int i;
    // return if constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return pRoot;
    // create mapping
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( i == nRootVars )
            break;
        assert( pPermute[i] >= 0 && pPermute[i] < Hop_ManPiNum(p) );
        pObj->pData = Hop_IthVar( p, pPermute[i] );
    }
    // recursively perform composition
    Hop_Remap_rec( p, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}